

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

void __thiscall capnp::FlatMessageBuilder::~FlatMessageBuilder(FlatMessageBuilder *this)

{
  FlatMessageBuilder *this_local;
  
  ~FlatMessageBuilder(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

FlatMessageBuilder::~FlatMessageBuilder() noexcept(false) {}